

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreModule.c
# Opt level: O0

cs_err XCore_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  XCore_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = XCore_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x18) = XCore_getInstruction;
  *(code **)(in_RDI + 0x48) = XCore_post_printer;
  *(code **)(in_RDI + 0x28) = XCore_reg_name;
  *(code **)(in_RDI + 0x40) = XCore_get_insn_id;
  *(code **)(in_RDI + 0x30) = XCore_insn_name;
  *(code **)(in_RDI + 0x38) = XCore_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err XCore_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	XCore_init(mri);
	ud->printer = XCore_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = XCore_getInstruction;
	ud->post_printer = XCore_post_printer;

	ud->reg_name = XCore_reg_name;
	ud->insn_id = XCore_get_insn_id;
	ud->insn_name = XCore_insn_name;
	ud->group_name = XCore_group_name;

	return CS_ERR_OK;
}